

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O0

void test_mp_nthroot(void)

{
  ulong uVar1;
  mp_int *x_00;
  mp_int *x_01;
  size_t sVar2;
  mp_int *x_02;
  byte local_21;
  ulong uStack_20;
  uint8_t sizes [1];
  size_t i;
  mp_int *remainder;
  mp_int *x;
  
  x_00 = mp_new(0x100);
  x_01 = mp_new(0x100);
  uStack_20 = 0;
  while( true ) {
    uVar1 = uStack_20;
    sVar2 = (*looplimit)(0x20);
    if (sVar2 <= uVar1) break;
    random_read(&local_21,1);
    mp_random_bits_into(x_00,(ulong)local_21);
    log_start();
    x_02 = mp_nthroot(x_00,3,x_01);
    mp_free(x_02);
    log_end();
    uStack_20 = uStack_20 + 1;
  }
  mp_free(x_00);
  mp_free(x_01);
  return;
}

Assistant:

static void test_mp_nthroot(void)
{
    mp_int *x = mp_new(256), *remainder = mp_new(256);

    for (size_t i = 0; i < looplimit(32); i++) {
        uint8_t sizes[1];
        random_read(sizes, 1);
        mp_random_bits_into(x, sizes[0]);
        log_start();
        mp_free(mp_nthroot(x, 3, remainder));
        log_end();
    }

    mp_free(x);
    mp_free(remainder);
}